

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_PlayerThink(player_t *player)

{
  ticcmd_t *ptVar1;
  TObjPtr<AActor> *obj;
  SBYTE *pSVar2;
  ActorFlags2 *pAVar3;
  float fVar4;
  double dVar5;
  char cVar6;
  short sVar7;
  float fVar8;
  undefined1 *puVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  AActor *pAVar17;
  ulong uVar18;
  FName *pFVar19;
  AInventory *pAVar20;
  short sVar21;
  short sVar22;
  uint uVar23;
  int iVar24;
  char *musicname;
  FMusicMap *this;
  APlayerPawn *pAVar25;
  APlayerPawn *thing;
  ulong uVar26;
  float fVar27;
  double dVar28;
  DAngle angle;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  DAngle angle_00;
  double dVar29;
  float fVar30;
  FName local_58;
  FName local_54;
  FSoundID local_50;
  FSoundID local_4c;
  FName local_48;
  FSoundID local_44;
  undefined8 local_40;
  undefined8 local_38;
  
  if (player->mo == (APlayerPawn *)0x0) {
    I_Error("No player %td start\n",(long)&player[-0x916e].morphTics / 0x2a0 + 1,
            (long)&player[-0x916e].morphTics % 0x2a0);
  }
  if ((debugfile != (FILE *)0x0) && ((player->cheats & 0x2000) == 0)) {
    pAVar25 = player->mo;
    fprintf((FILE *)debugfile,"tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n"
            ,(pAVar25->super_AActor).__Pos.X,(pAVar25->super_AActor).__Pos.Y,
            (pAVar25->super_AActor).__Pos.Z,(pAVar25->super_AActor).Angles.Yaw.Degrees,
            (ulong)(uint)gametic,(long)&player[-0x916e].morphTics / 0x2a0 & 0xffffffff,
            (ulong)(player->cmd).ucmd.buttons,(ulong)(uint)(int)(player->cmd).ucmd.pitch,
            (ulong)(uint)(int)(player->cmd).ucmd.yaw,
            (ulong)(uint)(int)(player->cmd).ucmd.forwardmove,
            (ulong)(uint)(int)(player->cmd).ucmd.sidemove,
            (ulong)(uint)(int)(player->cmd).ucmd.upmove);
  }
  fVar27 = player->DesiredFOV;
  if ((player->playerstate != '\x01') && (player->ReadyWeapon != (AWeapon *)0x0)) {
    fVar4 = player->ReadyWeapon->FOVScale;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      fVar27 = fVar27 * ABS(fVar4);
    }
  }
  fVar4 = player->FOV;
  if ((fVar4 != fVar27) || (NAN(fVar4) || NAN(fVar27))) {
    if (7.0 <= ABS(fVar4 - fVar27)) {
      fVar30 = ABS(fVar4 - fVar27) * 0.025;
      fVar8 = 7.0;
      if (7.0 <= fVar30) {
        fVar8 = fVar30;
      }
      fVar27 = (float)(-(uint)(fVar27 < fVar4) & (uint)-fVar8 |
                      ~-(uint)(fVar27 < fVar4) & (uint)fVar8) + fVar4;
    }
    player->FOV = fVar27;
  }
  if (player->inventorytics != 0) {
    player->inventorytics = player->inventorytics + -1;
  }
  uVar23 = 0xffffbfff;
  if ((player->cheats & 0x40000001U) == 0x40000000) {
    uVar23 = 0xbfffbffe;
  }
  uVar23 = uVar23 & player->cheats;
  player->cheats = uVar23;
  pAVar25 = player->mo;
  if ((uVar23 & 0x40000001) == 0) {
    pAVar17 = AActor::GetDefault(&pAVar25->super_AActor);
    pAVar25 = player->mo;
    if (((pAVar17->flags).Value & 0x1000) != 0) goto LAB_00465162;
    uVar23 = (pAVar25->super_AActor).flags.Value & 0xffffefff;
  }
  else {
LAB_00465162:
    uVar23 = (pAVar25->super_AActor).flags.Value | 0x1000;
  }
  (pAVar25->super_AActor).flags.Value = uVar23;
  if ((player->cheats & 0x40000000) == 0) {
    if (((pAVar25->super_AActor).flags2.Value & 0x10) == 0) {
      pAVar17 = AActor::GetDefault(&pAVar25->super_AActor);
      pAVar25 = player->mo;
      if (((pAVar17->flags).Value & 0x200) == 0) {
        puVar9 = (undefined1 *)((long)&(pAVar25->super_AActor).flags.Value + 1);
        *puVar9 = *puVar9 & 0xfd;
      }
    }
  }
  else {
    (pAVar25->super_AActor).flags.Value = uVar23 | 0x200;
  }
  player->original_oldbuttons = (player->original_cmd).buttons;
  sVar7 = (player->cmd).ucmd.pitch;
  sVar21 = (player->cmd).ucmd.yaw;
  sVar22 = (player->cmd).ucmd.roll;
  sVar10 = (player->cmd).ucmd.forwardmove;
  sVar11 = (player->cmd).ucmd.sidemove;
  sVar12 = (player->cmd).ucmd.upmove;
  (player->original_cmd).buttons = (player->cmd).ucmd.buttons;
  (player->original_cmd).pitch = sVar7;
  (player->original_cmd).yaw = sVar21;
  (player->original_cmd).roll = sVar22;
  (player->original_cmd).forwardmove = sVar10;
  (player->original_cmd).sidemove = sVar11;
  (player->original_cmd).upmove = sVar12;
  uVar23 = (pAVar25->super_AActor).flags.Value;
  if ((char)uVar23 < '\0') {
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.forwardmove = 0x6400;
    (player->cmd).ucmd.sidemove = 0;
    (pAVar25->super_AActor).flags.Value = uVar23 & 0xffffff7f;
  }
  ptVar1 = &player->cmd;
  bVar13 = P_IsPlayerTotallyFrozen(player);
  if (bVar13) {
    uVar23 = 0;
    if (gamestate != GS_TITLELEVEL) {
      uVar23 = (ptVar1->ucmd).buttons & 2;
    }
    (player->cmd).ucmd.buttons = uVar23;
    player->turnticks = '\0';
    (player->cmd).ucmd.pitch = 0;
    (player->cmd).ucmd.yaw = 0;
    (player->cmd).ucmd.roll = 0;
    (player->cmd).ucmd.forwardmove = 0;
    (player->cmd).ucmd.sidemove = 0;
    (player->cmd).ucmd.upmove = 0;
  }
  else if ((player->cheats & 0x40) != 0) {
    (player->cmd).ucmd.forwardmove = 0;
    (player->cmd).ucmd.sidemove = 0;
    (player->cmd).ucmd.upmove = 0;
  }
  uVar23 = (ptVar1->ucmd).buttons;
  if ((uVar23 & 4) != 0) {
    (ptVar1->ucmd).buttons = uVar23 & 0xfffffff7;
  }
  if ((((player->morphTics == 0) || ((pAVar25->PlayerFlags & 4) != 0)) && (0 < player->health)) &&
     (bVar14 = FLevelLocals::IsCrouchingAllowed(&level), bVar14)) {
    if (!bVar13) {
      cVar6 = player->crouching;
      uVar23 = (player->cmd).ucmd.buttons;
      if (cVar6 == '\0') {
        if ((uVar23 & 8) != 0) goto LAB_004653eb;
LAB_004653af:
        if ((1.0 < player->crouchfactor || player->crouchfactor == 1.0) ||
           (pAVar25 = player->mo,
           (pAVar25->super_AActor).ceilingz <=
           (pAVar25->super_AActor).__Pos.Z + (pAVar25->super_AActor).Height)) goto LAB_004652af;
        iVar15 = 1;
LAB_00465403:
        P_CrouchMove(player,iVar15);
      }
      else {
        if ((uVar23 & 8) != 0) {
          player->crouching = '\0';
        }
        if (cVar6 == -1) {
LAB_004653eb:
          if (0.5 < player->crouchfactor) {
            iVar15 = -1;
            goto LAB_00465403;
          }
        }
        else if (cVar6 == '\x01') goto LAB_004653af;
      }
    }
  }
  else {
    player_t::Uncrouch(player);
  }
LAB_004652af:
  player->crouchoffset = (1.0 - player->crouchfactor) * -player->mo->ViewHeight;
  if (player->MUSINFOtics < '\0') goto LAB_00465446;
  obj = &player->MUSINFOactor;
  pAVar17 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar17 == (AActor *)0x0) goto LAB_00465446;
  pSVar2 = &player->MUSINFOtics;
  *pSVar2 = *pSVar2 + -1;
  if (-1 < *pSVar2) goto LAB_00465446;
  uVar18 = (long)&player[-0x916e].morphTics / 0x2a0;
  if (uVar18 == (long)consoleplayer) {
    pAVar17 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar17->args[0] == 0) {
      musicname = "*";
      iVar15 = 0;
    }
    else {
      this = &(level.info)->MusicMap;
      pAVar17 = GC::ReadBarrier<AActor>((AActor **)obj);
      pFVar19 = TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::CheckKey
                          (this,pAVar17->args[0]);
      if (pFVar19 == (FName *)0x0) goto LAB_00465424;
      musicname = FName::NameData.NameArray[pFVar19->Index].Text;
      pAVar17 = GC::ReadBarrier<AActor>((AActor **)obj);
      iVar15 = pAVar17->args[1];
    }
    S_ChangeMusic(musicname,iVar15,true,false);
  }
LAB_00465424:
  pAVar17 = GC::ReadBarrier<AActor>((AActor **)obj);
  DPrintf(3,"MUSINFO change for player %d to %d\n",uVar18 & 0xffffffff,(ulong)(uint)pAVar17->args[0]
         );
LAB_00465446:
  if (player->playerstate != '\x01') {
    iVar15 = player->jumpTics;
    if (iVar15 != 0) {
      iVar24 = 0;
      if (player->onground == false) {
        iVar24 = iVar15 + -1;
      }
      if (-0x12 < iVar15) {
        iVar24 = iVar15 + -1;
      }
      player->jumpTics = iVar24;
    }
    if ((player->morphTics != 0) && ((player->cheats & 0x2000) == 0)) {
      APlayerPawn::MorphPlayerThink(player->mo);
    }
    bVar13 = FLevelLocals::IsFreelookAllowed(&level);
    if (bVar13) {
      sVar7 = (player->cmd).ucmd.pitch;
      if (sVar7 != 0) {
        if (sVar7 == -0x8000) {
          player->centering = true;
        }
        else if (player->centering == false) {
          dVar29 = (double)(int)sVar7 * -0.0054931640625 +
                   (player->mo->super_AActor).Angles.Pitch.Degrees;
          dVar28 = (player->MinPitch).Degrees;
          dVar5 = (player->MaxPitch).Degrees;
          uVar18 = -(ulong)(dVar5 <= dVar29);
          uVar26 = -(ulong)(dVar28 < dVar29);
          (player->mo->super_AActor).Angles.Pitch.Degrees =
               (double)(~uVar26 & (ulong)dVar28 |
                       (uVar18 & (ulong)dVar5 | ~uVar18 & (ulong)dVar29) & uVar26);
        }
      }
    }
    else {
      (player->mo->super_AActor).Angles.Pitch.Degrees = 0.0;
    }
    if (player->centering == true) {
      pAVar25 = player->mo;
      dVar28 = (pAVar25->super_AActor).Angles.Pitch.Degrees;
      if (ABS(dVar28) <= 2.0) {
        (pAVar25->super_AActor).Angles.Pitch.Degrees = 0.0;
        player->centering = false;
        if ((long)&player[-0x916e].morphTics / 0x2a0 == (long)consoleplayer) {
          LocalViewPitch = 0;
        }
      }
      else {
        (pAVar25->super_AActor).Angles.Pitch.Degrees = dVar28 * 0.6666666666666666;
      }
    }
    if ((((ptVar1->ucmd).buttons & 0x10) != 0) && ((player->oldbuttons & 0x10) == 0)) {
      player->turnticks = '\t';
    }
    iVar15 = (player->mo->super_AActor).reactiontime;
    if (iVar15 == 0) {
      P_MovePlayer(player);
      if (((player->cmd).ucmd.buttons & 4) != 0) {
        if ((player->crouchoffset != 0.0) || (NAN(player->crouchoffset))) {
          player->crouching = '\x01';
        }
        else {
          pAVar25 = player->mo;
          if ((pAVar25->super_AActor).waterlevel < 2) {
            if (((pAVar25->super_AActor).flags.Value & 0x200) == 0) {
              bVar13 = FLevelLocals::IsJumpingAllowed(&level);
              if (((bVar13) && (player->onground == true)) && (player->jumpTics == 0)) {
                pAVar25 = player->mo;
                dVar28 = (pAVar25->JumpZ * 35.0) / 35.0;
                uVar23 = player->cheats;
                if ((uVar23 >> 0x12 & 1) != 0) {
                  dVar28 = dVar28 + dVar28;
                }
                (pAVar25->super_AActor).Vel.Z = dVar28 + (pAVar25->super_AActor).Vel.Z;
                puVar9 = (undefined1 *)((long)&(pAVar25->super_AActor).flags2.Value + 1);
                *puVar9 = *puVar9 & 0xf7;
                player->jumpTics = -1;
                if ((uVar23 >> 0xd & 1) == 0) {
                  local_44.ID = S_FindSound("*jump");
                  S_Sound(&pAVar25->super_AActor,4,&local_44,1.0,1.0);
                }
              }
            }
            else {
              (pAVar25->super_AActor).Vel.Z = 3.0;
            }
          }
          else {
            (pAVar25->super_AActor).Vel.Z = (pAVar25->super_AActor).Speed * 4.0;
          }
        }
      }
      sVar7 = (player->cmd).ucmd.upmove;
      if (sVar7 != 0) {
        if (sVar7 == -0x8000) {
          pAVar25 = player->mo;
          uVar23 = (pAVar25->super_AActor).flags.Value;
          if (((uVar23 >> 9 & 1) != 0) && ((pAVar25->super_AActor).waterlevel < 2)) {
            (pAVar25->super_AActor).flags.Value = uVar23 & 0xfffffdff;
          }
        }
        else {
          sVar21 = 0x300;
          if (sVar7 < 0x300) {
            sVar21 = sVar7;
          }
          sVar22 = -0x300;
          if (-0x300 < sVar21) {
            sVar22 = sVar21;
          }
          (player->cmd).ucmd.upmove = sVar22;
          pAVar25 = player->mo;
          iVar15 = (pAVar25->super_AActor).waterlevel;
          if (((iVar15 < 2) && (((pAVar25->super_AActor).flags2.Value & 0x10) == 0)) &&
             (((uint)player->cheats >> 0x1e & 1) == 0)) {
            if (((uint)player->cheats >> 0xd & 1) == 0 && 0 < sVar7) {
              local_48.Index = 0x61;
              pAVar20 = AActor::FindInventory(&pAVar25->super_AActor,&local_48);
              if (pAVar20 != (AInventory *)0x0) {
                (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])();
              }
            }
          }
          else {
            dVar28 = (double)(int)sVar22 * (pAVar25->super_AActor).Speed * 0.0078125;
            (pAVar25->super_AActor).Vel.Z = dVar28;
            if ((iVar15 < 2) &&
               (uVar23 = (pAVar25->super_AActor).flags.Value, (uVar23 >> 9 & 1) == 0)) {
              pAVar3 = &(pAVar25->super_AActor).flags2;
              *(byte *)&pAVar3->Value = (byte)pAVar3->Value | 0x10;
              (pAVar25->super_AActor).flags.Value = uVar23 | 0x200;
              if ((dVar28 <= -39.0) && ((player->cheats & 0x2000) == 0)) {
                S_StopSound(&pAVar25->super_AActor,2);
              }
            }
          }
        }
      }
    }
    else {
      (player->mo->super_AActor).reactiontime = iVar15 + -1;
    }
    P_CalcHeight(player);
    if ((player->cheats & 0x2000) == 0) {
      P_PlayerOnSpecial3DFloor(player);
      P_PlayerInSpecialSector(player,(sector_t *)0x0);
      pAVar25 = player->mo;
      dVar28 = secplane_t::ZatPoint
                         (&((pAVar25->super_AActor).Sector)->floorplane,&pAVar25->super_AActor);
      thing = player->mo;
      if (((pAVar25->super_AActor).__Pos.Z <= dVar28 + 1.52587890625e-05) ||
         ((thing->super_AActor).waterlevel != 0)) {
        iVar15 = P_GetThingFloorType(&thing->super_AActor);
        P_PlayerOnSpecialFlat(player,iVar15);
        thing = player->mo;
      }
      dVar28 = (thing->super_AActor).Vel.Z;
      if ((((dVar28 <= -thing->FallingScreamMinSpeed) && (-thing->FallingScreamMaxSpeed <= dVar28))
          && (player->morphTics == 0)) && ((thing->super_AActor).waterlevel == 0)) {
        local_4c.ID = S_FindSound("*falling");
        iVar15 = S_FindSkinnedSound(&thing->super_AActor,&local_4c);
        if ((iVar15 != 0) &&
           (bVar13 = S_IsActorPlayingSomething(&player->mo->super_AActor,2,iVar15), !bVar13)) {
          local_50.ID = iVar15;
          S_Sound(&player->mo->super_AActor,2,&local_50,1.0,1.0);
        }
      }
      if (((player->cmd).ucmd.buttons & 2) == 0) {
        player->usedown = false;
      }
      else if (player->usedown == false) {
        player->usedown = true;
        bVar13 = P_TalkFacing(&player->mo->super_AActor);
        if (!bVar13) {
          P_UseLines(player);
        }
      }
      if (player->morphTics != 0) {
        if (player->chickenPeck != 0) {
          player->chickenPeck = player->chickenPeck + -3;
        }
        iVar15 = player->morphTics + -1;
        player->morphTics = iVar15;
        if (iVar15 == 0) {
          P_UndoPlayerMorph(player,player,0x1000,false);
        }
      }
      player_t::TickPSprites(player);
      if (player->damagecount != 0) {
        player->damagecount = player->damagecount + -1;
      }
      if (player->bonuscount != 0) {
        player->bonuscount = player->bonuscount + -1;
      }
      iVar15 = player->hazardcount;
      angle_00.Degrees = angle.Degrees;
      if (iVar15 != 0) {
        player->hazardcount = iVar15 + -1;
        if ((0x231 < iVar15) && (level.time % player->hazardinterval == 0)) {
          local_54.Index = (player->hazardtype).Index;
          local_38 = 0;
          P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,5,&local_54,0,angle);
          angle_00.Degrees = extraout_XMM0_Qa;
        }
      }
      iVar15 = player->poisoncount;
      if ((iVar15 != 0) && ((level.time & 0xfU) == 0)) {
        iVar24 = 0;
        if (4 < iVar15) {
          iVar24 = iVar15 + -5;
        }
        player->poisoncount = iVar24;
        pAVar17 = GC::ReadBarrier<AActor>((AActor **)&player->poisoner);
        P_PoisonDamage(player,pAVar17,1,true);
        angle_00.Degrees = extraout_XMM0_Qa_00;
      }
      pAVar25 = player->mo;
      if ((((byte)dmflags2.Value & 0x80) != 0) &&
         (iVar15 = APlayerPawn::GetMaxHealth(pAVar25), angle_00.Degrees = extraout_XMM0_Qa_01,
         level.time % 0x23 == 0)) {
        iVar15 = iVar15 + (pAVar25->super_AActor).stamina;
        iVar24 = player->health;
        if (iVar15 < iVar24) {
          iVar16 = iVar24 + -1;
          if (iVar24 + -5 < iVar15) {
            iVar16 = iVar15;
          }
          player->health = iVar16;
          (pAVar25->super_AActor).health = iVar16;
        }
      }
      if ((((pAVar25->super_AActor).waterlevel < 3) ||
          (((pAVar25->super_AActor).flags2.Value & 0x8000000) != 0)) ||
         ((player->cheats & 0x42000002U) != 0)) {
        APlayerPawn::ResetAirSupply(pAVar25,true);
      }
      else if ((level.time & 0x1fU) == 0 && player->air_finished <= level.time) {
        local_58.Index = 0xbf;
        local_40 = 0;
        P_DamageMobj(&pAVar25->super_AActor,(AActor *)0x0,(AActor *)0x0,
                     (level.time - player->air_finished) / 0x23 + 2,&local_58,0,angle_00);
      }
    }
    return;
  }
  player_t::Uncrouch(player);
  P_DeathThink(player);
  return;
}

Assistant:

void P_PlayerThink (player_t *player)
{
	ticcmd_t *cmd;

	if (player->mo == NULL)
	{
		I_Error ("No player %td start\n", player - players + 1);
	}

	if (debugfile && !(player->cheats & CF_PREDICTING))
	{
		fprintf (debugfile, "tic %d for pl %d: (%f, %f, %f, %f) b:%02x p:%d y:%d f:%d s:%d u:%d\n",
			gametic, (int)(player-players), player->mo->X(), player->mo->Y(), player->mo->Z(),
			player->mo->Angles.Yaw.Degrees, player->cmd.ucmd.buttons,
			player->cmd.ucmd.pitch, player->cmd.ucmd.yaw, player->cmd.ucmd.forwardmove,
			player->cmd.ucmd.sidemove, player->cmd.ucmd.upmove);
	}

	// [RH] Zoom the player's FOV
	float desired = player->DesiredFOV;
	// Adjust FOV using on the currently held weapon.
	if (player->playerstate != PST_DEAD &&		// No adjustment while dead.
		player->ReadyWeapon != NULL &&			// No adjustment if no weapon.
		player->ReadyWeapon->FOVScale != 0)		// No adjustment if the adjustment is zero.
	{
		// A negative scale is used to prevent G_AddViewAngle/G_AddViewPitch
		// from scaling with the FOV scale.
		desired *= fabsf(player->ReadyWeapon->FOVScale);
	}
	if (player->FOV != desired)
	{
		if (fabsf (player->FOV - desired) < 7.f)
		{
			player->FOV = desired;
		}
		else
		{
			float zoom = MAX(7.f, fabsf(player->FOV - desired) * 0.025f);
			if (player->FOV > desired)
			{
				player->FOV = player->FOV - zoom;
			}
			else
			{
				player->FOV = player->FOV + zoom;
			}
		}
	}
	if (player->inventorytics)
	{
		player->inventorytics--;
	}
	// Don't interpolate the view for more than one tic
	player->cheats &= ~CF_INTERPVIEW;

	// No-clip cheat
	if ((player->cheats & (CF_NOCLIP | CF_NOCLIP2)) == CF_NOCLIP2)
	{ // No noclip2 without noclip
		player->cheats &= ~CF_NOCLIP2;
	}
	if (player->cheats & (CF_NOCLIP | CF_NOCLIP2) || (player->mo->GetDefault()->flags & MF_NOCLIP))
	{
		player->mo->flags |= MF_NOCLIP;
	}
	else
	{
		player->mo->flags &= ~MF_NOCLIP;
	}
	if (player->cheats & CF_NOCLIP2)
	{
		player->mo->flags |= MF_NOGRAVITY;
	}
	else if (!(player->mo->flags2 & MF2_FLY) && !(player->mo->GetDefault()->flags & MF_NOGRAVITY))
	{
		player->mo->flags &= ~MF_NOGRAVITY;
	}
	cmd = &player->cmd;

	// Make unmodified copies for ACS's GetPlayerInput.
	player->original_oldbuttons = player->original_cmd.buttons;
	player->original_cmd = cmd->ucmd;

	if (player->mo->flags & MF_JUSTATTACKED)
	{ // Chainsaw/Gauntlets attack auto forward motion
		cmd->ucmd.yaw = 0;
		cmd->ucmd.forwardmove = 0xc800/2;
		cmd->ucmd.sidemove = 0;
		player->mo->flags &= ~MF_JUSTATTACKED;
	}

	bool totallyfrozen = P_IsPlayerTotallyFrozen(player);

	// [RH] Being totally frozen zeros out most input parameters.
	if (totallyfrozen)
	{
		if (gamestate == GS_TITLELEVEL)
		{
			cmd->ucmd.buttons = 0;
		}
		else
		{
			cmd->ucmd.buttons &= BT_USE;
		}
		cmd->ucmd.pitch = 0;
		cmd->ucmd.yaw = 0;
		cmd->ucmd.roll = 0;
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
		player->turnticks = 0;
	}
	else if (player->cheats & CF_FROZEN)
	{
		cmd->ucmd.forwardmove = 0;
		cmd->ucmd.sidemove = 0;
		cmd->ucmd.upmove = 0;
	}

	// Handle crouching
	if (player->cmd.ucmd.buttons & BT_JUMP)
	{
		player->cmd.ucmd.buttons &= ~BT_CROUCH;
	}
	if (player->CanCrouch() && player->health > 0 && level.IsCrouchingAllowed())
	{
		if (!totallyfrozen)
		{
			int crouchdir = player->crouching;
		
			if (crouchdir == 0)
			{
				crouchdir = (player->cmd.ucmd.buttons & BT_CROUCH) ? -1 : 1;
			}
			else if (player->cmd.ucmd.buttons & BT_CROUCH)
			{
				player->crouching = 0;
			}
			if (crouchdir == 1 && player->crouchfactor < 1 &&
				player->mo->Top() < player->mo->ceilingz)
			{
				P_CrouchMove(player, 1);
			}
			else if (crouchdir == -1 && player->crouchfactor > 0.5)
			{
				P_CrouchMove(player, -1);
			}
		}
	}
	else
	{
		player->Uncrouch();
	}

	player->crouchoffset = -(player->mo->ViewHeight) * (1 - player->crouchfactor);

	// MUSINFO stuff
	if (player->MUSINFOtics >= 0 && player->MUSINFOactor != NULL)
	{
		if (--player->MUSINFOtics < 0)
		{
			if (player - players == consoleplayer)
			{
				if (player->MUSINFOactor->args[0] != 0)
				{
					FName *music = level.info->MusicMap.CheckKey(player->MUSINFOactor->args[0]);

					if (music != NULL)
					{
						S_ChangeMusic(music->GetChars(), player->MUSINFOactor->args[1]);
					}
				}
				else
				{
					S_ChangeMusic("*");
				}
			}
			DPrintf(DMSG_NOTIFY, "MUSINFO change for player %d to %d\n", (int)(player - players), player->MUSINFOactor->args[0]);
		}
	}

	if (player->playerstate == PST_DEAD)
	{
		player->Uncrouch();
		P_DeathThink (player);
		return;
	}
	if (player->jumpTics != 0)
	{
		player->jumpTics--;
		if (player->onground && player->jumpTics < -18)
		{
			player->jumpTics = 0;
		}
	}
	if (player->morphTics && !(player->cheats & CF_PREDICTING))
	{
		player->mo->MorphPlayerThink ();
	}

	// [RH] Look up/down stuff
	if (!level.IsFreelookAllowed())
	{
		player->mo->Angles.Pitch = 0.;
	}
	else
	{
		// The player's view pitch is clamped between -32 and +56 degrees,
		// which translates to about half a screen height up and (more than)
		// one full screen height down from straight ahead when view panning
		// is used.
		int clook = cmd->ucmd.pitch;
		if (clook != 0)
		{
			if (clook == -32768)
			{ // center view
				player->centering = true;
			}
			else if (!player->centering)
			{
				// no more overflows with floating point. Yay! :)
				player->mo->Angles.Pitch = clamp(player->mo->Angles.Pitch - clook * (360. / 65536.), player->MinPitch, player->MaxPitch);
			}
		}
	}
	if (player->centering)
	{
		if (fabs(player->mo->Angles.Pitch) > 2.)
		{
			player->mo->Angles.Pitch *= (2. / 3.);
		}
		else
		{
			player->mo->Angles.Pitch = 0.;
			player->centering = false;
			if (player - players == consoleplayer)
			{
				LocalViewPitch = 0;
			}
		}
	}

	// [RH] Check for fast turn around
	if (cmd->ucmd.buttons & BT_TURN180 && !(player->oldbuttons & BT_TURN180))
	{
		player->turnticks = TURN180_TICKS;
	}

	// Handle movement
	if (player->mo->reactiontime)
	{ // Player is frozen
		player->mo->reactiontime--;
	}
	else
	{
		P_MovePlayer (player);

		// [RH] check for jump
		if (cmd->ucmd.buttons & BT_JUMP)
		{
			if (player->crouchoffset != 0)
			{
				// Jumping while crouching will force an un-crouch but not jump
				player->crouching = 1;
			}
			else if (player->mo->waterlevel >= 2)
			{
				player->mo->Vel.Z = 4 * player->mo->Speed;
			}
			else if (player->mo->flags & MF_NOGRAVITY)
			{
				player->mo->Vel.Z = 3.;
			}
			else if (level.IsJumpingAllowed() && player->onground && player->jumpTics == 0)
			{
				double jumpvelz = player->mo->JumpZ * 35 / TICRATE;

				// [BC] If the player has the high jump power, double his jump velocity.
				if ( player->cheats & CF_HIGHJUMP )	jumpvelz *= 2;

				player->mo->Vel.Z += jumpvelz;
				player->mo->flags2 &= ~MF2_ONMOBJ;
				player->jumpTics = -1;
				if (!(player->cheats & CF_PREDICTING))
					S_Sound(player->mo, CHAN_BODY, "*jump", 1, ATTN_NORM);
			}
		}

		if (cmd->ucmd.upmove == -32768)
		{ // Only land if in the air
			if ((player->mo->flags & MF_NOGRAVITY) && player->mo->waterlevel < 2)
			{
				//player->mo->flags2 &= ~MF2_FLY;
				player->mo->flags &= ~MF_NOGRAVITY;
			}
		}
		else if (cmd->ucmd.upmove != 0)
		{
			// Clamp the speed to some reasonable maximum.
			cmd->ucmd.upmove = clamp<short>(cmd->ucmd.upmove, -0x300, 0x300);
			if (player->mo->waterlevel >= 2 || (player->mo->flags2 & MF2_FLY) || (player->cheats & CF_NOCLIP2))
			{
				player->mo->Vel.Z = player->mo->Speed * cmd->ucmd.upmove / 128.;
				if (player->mo->waterlevel < 2 && !(player->mo->flags & MF_NOGRAVITY))
				{
					player->mo->flags2 |= MF2_FLY;
					player->mo->flags |= MF_NOGRAVITY;
					if ((player->mo->Vel.Z <= -39) && !(player->cheats & CF_PREDICTING))
					{ // Stop falling scream
						S_StopSound (player->mo, CHAN_VOICE);
					}
				}
			}
			else if (cmd->ucmd.upmove > 0 && !(player->cheats & CF_PREDICTING))
			{
				AInventory *fly = player->mo->FindInventory (NAME_ArtiFly);
				if (fly != NULL)
				{
					player->mo->UseInventory (fly);
				}
			}
		}
	}

	P_CalcHeight (player);

	if (!(player->cheats & CF_PREDICTING))
	{
		P_PlayerOnSpecial3DFloor (player);
		P_PlayerInSpecialSector (player);

		if (!player->mo->isAbove(player->mo->Sector->floorplane.ZatPoint(player->mo)) ||
			player->mo->waterlevel)
		{
			// Player must be touching the floor
			P_PlayerOnSpecialFlat(player, P_GetThingFloorType(player->mo));
		}
		if (player->mo->Vel.Z <= -player->mo->FallingScreamMinSpeed &&
			player->mo->Vel.Z >= -player->mo->FallingScreamMaxSpeed && !player->morphTics &&
			player->mo->waterlevel == 0)
		{
			int id = S_FindSkinnedSound (player->mo, "*falling");
			if (id != 0 && !S_IsActorPlayingSomething (player->mo, CHAN_VOICE, id))
			{
				S_Sound (player->mo, CHAN_VOICE, id, 1, ATTN_NORM);
			}
		}
		// check for use
		if (cmd->ucmd.buttons & BT_USE)
		{
			if (!player->usedown)
			{
				player->usedown = true;
				if (!P_TalkFacing(player->mo))
				{
					P_UseLines(player);
				}
			}
		}
		else
		{
			player->usedown = false;
		}
		// Morph counter
		if (player->morphTics)
		{
			if (player->chickenPeck)
			{ // Chicken attack counter
				player->chickenPeck -= 3;
			}
			if (!--player->morphTics)
			{ // Attempt to undo the chicken/pig
				P_UndoPlayerMorph (player, player, MORPH_UNDOBYTIMEOUT);
			}
		}
		// Cycle psprites
		player->TickPSprites();

		// Other Counters
		if (player->damagecount)
			player->damagecount--;

		if (player->bonuscount)
			player->bonuscount--;

		if (player->hazardcount)
		{
			player->hazardcount--;
			if (!(level.time % player->hazardinterval) && player->hazardcount > 16*TICRATE)
				P_DamageMobj (player->mo, NULL, NULL, 5, player->hazardtype);
		}

		if (player->poisoncount && !(level.time & 15))
		{
			player->poisoncount -= 5;
			if (player->poisoncount < 0)
			{
				player->poisoncount = 0;
			}
			P_PoisonDamage (player, player->poisoner, 1, true);
		}

		// Apply degeneration.
		if (dmflags2 & DF2_YES_DEGENERATION)
		{
			int maxhealth = player->mo->GetMaxHealth() + player->mo->stamina;
			if ((level.time % TICRATE) == 0 && player->health > maxhealth)
			{
				if (player->health - 5 < maxhealth)
					player->health = maxhealth;
				else
					player->health--;

				player->mo->health = player->health;
			}
		}

		// Handle air supply
		//if (level.airsupply > 0)
		{
			if (player->mo->waterlevel < 3 ||
				(player->mo->flags2 & MF2_INVULNERABLE) ||
				(player->cheats & (CF_GODMODE | CF_NOCLIP2)) ||
				(player->cheats & CF_GODMODE2))
			{
				player->mo->ResetAirSupply ();
			}
			else if (player->air_finished <= level.time && !(level.time & 31))
			{
				P_DamageMobj (player->mo, NULL, NULL, 2 + ((level.time-player->air_finished)/TICRATE), NAME_Drowning);
			}
		}
	}
}